

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O1

int izamax(int n,complex<double> *x,int incx)

{
  int iVar1;
  undefined4 in_register_0000003c;
  int iVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  complex<double> z;
  complex<double> z_00;
  complex<double> z_01;
  complex<double> z_02;
  complex<double> z_03;
  double local_38;
  
  z._M_value._0_8_ = CONCAT44(in_register_0000003c,n);
  iVar1 = 0;
  if ((0 < incx && 0 < n) && (iVar1 = 1, n != 1)) {
    z._M_value._8_8_ = x;
    local_38 = zabs1(z);
    if (incx == 1) {
      if (1 < n) {
        iVar2 = 2;
        lVar3 = 0;
        do {
          z_00._M_value._8_8_ = x;
          z_00._M_value._0_8_ = z._M_value._0_8_;
          dVar5 = zabs1(z_00);
          if (local_38 < dVar5) {
            z_01._M_value._8_8_ = x;
            z_01._M_value._0_8_ = z._M_value._0_8_;
            local_38 = zabs1(z_01);
            iVar1 = iVar2;
          }
          iVar2 = iVar2 + 1;
          lVar3 = lVar3 + 0x10;
        } while ((ulong)(uint)n * 0x10 + -0x10 != lVar3);
      }
    }
    else if (1 < n) {
      iVar2 = 2;
      do {
        z_02._M_value._8_8_ = x;
        z_02._M_value._0_8_ = z._M_value._0_8_;
        dVar5 = zabs1(z_02);
        if (local_38 < dVar5) {
          z_03._M_value._8_8_ = x;
          z_03._M_value._0_8_ = z._M_value._0_8_;
          local_38 = zabs1(z_03);
          iVar1 = iVar2;
        }
        bVar4 = iVar2 != n;
        iVar2 = iVar2 + 1;
      } while (bVar4);
    }
  }
  return iVar1;
}

Assistant:

int izamax ( int n, complex <double> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    IZAMAX indexes the complex <double> vector element of maximum absolute value.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    WARNING: This index is a 1-based index, not a 0-based index!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <double> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, int IZAMAX, the index of the element of maximum
//    absolute value.
//
{
  int i;
  int ix;
  double smax;
  int value;

  value = 0;

  if ( n < 1 || incx  <=  0 )
  {
    return value;
  }

  value = 1;

  if ( n == 1 )
  {
    return value;
  }

  if ( incx != 1 )
  {
    ix = 0;
    smax = zabs1 ( x[0] );
    ix = ix + incx;

    for ( i = 1; i < n; i++ )
    {
      if ( smax < zabs1 ( x[ix] ) )
      {
        value = i + 1;
        smax = zabs1 ( x[ix] );
      }
      ix = ix + incx;
    }
  }
  else
  {
    smax = zabs1 ( x[0] );
    for ( i = 1; i < n; i++ )
    {
      if ( smax < zabs1 ( x[i] ) )
      {
        value = i + 1;
        smax = zabs1 ( x[i] );
      }
    }
  }

  return value;
}